

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootCheck1(void *arkode_mem)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  double dVar10;
  
  if (arkode_mem == (void *)0x0) {
    iVar6 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x1a5,"arkRootCheck1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    puVar3 = *(undefined8 **)((long)arkode_mem + 0x3a0);
    if (0 < *(int *)(puVar3 + 1)) {
      lVar4 = puVar3[2];
      lVar7 = 0;
      do {
        *(undefined4 *)(lVar4 + lVar7 * 4) = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)(puVar3 + 1));
    }
    dVar1 = *(double *)((long)arkode_mem + 0x2d0);
    puVar3[4] = dVar1;
    puVar3[0xb] = (ABS(*(double *)((long)arkode_mem + 0x2a0)) + ABS(dVar1)) *
                  *(double *)((long)arkode_mem + 8) * 100.0;
    iVar5 = (*(code *)*puVar3)(*(undefined8 *)((long)arkode_mem + 0x230),puVar3[7],puVar3[0x10]);
    puVar3[0xd] = 1;
    iVar6 = -0xc;
    if (iVar5 == 0) {
      uVar9 = (ulong)*(uint *)(puVar3 + 1);
      if (0 < (int)*(uint *)(puVar3 + 1)) {
        lVar4 = puVar3[7];
        bVar8 = true;
        lVar7 = 0;
        do {
          while ((dVar1 = *(double *)(lVar4 + lVar7 * 8), dVar1 != 0.0 || (NAN(dVar1)))) {
            lVar7 = lVar7 + 1;
            if ((int)uVar9 <= lVar7) {
              if (bVar8) goto LAB_001499cf;
              goto LAB_001499d6;
            }
          }
          *(undefined4 *)(puVar3[0xe] + lVar7 * 4) = 0;
          uVar9 = (ulong)*(int *)(puVar3 + 1);
          lVar7 = lVar7 + 1;
          bVar8 = false;
        } while (lVar7 < (long)uVar9);
LAB_001499d6:
        dVar1 = *(double *)((long)arkode_mem + 0x2a0);
        dVar10 = (double)puVar3[0xb] / ABS(dVar1);
        if (dVar10 <= 0.1) {
          dVar10 = 0.1;
        }
        dVar2 = (double)puVar3[4];
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x230),
                     *(undefined8 *)((long)arkode_mem + 0x238),
                     *(undefined8 *)((long)arkode_mem + 0x228));
        iVar6 = (*(code *)*puVar3)(dVar2 + dVar10 * dVar1,*(undefined8 *)((long)arkode_mem + 0x228),
                                   puVar3[8],puVar3[0x10]);
        puVar3[0xd] = puVar3[0xd] + 1;
        if (iVar6 != 0) {
          return -0xc;
        }
        iVar6 = *(int *)(puVar3 + 1);
        if (0 < iVar6) {
          lVar4 = puVar3[0xe];
          lVar7 = 0;
          do {
            if (*(int *)(lVar4 + lVar7 * 4) == 0) {
              dVar1 = *(double *)(puVar3[8] + lVar7 * 8);
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                *(undefined4 *)(lVar4 + lVar7 * 4) = 1;
                *(double *)(puVar3[7] + lVar7 * 8) = dVar1;
                iVar6 = *(int *)(puVar3 + 1);
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar6);
          return 0;
        }
      }
LAB_001499cf:
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int arkRootCheck1(void* arkode_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->iroots[i] = 0; }
  rootmem->tlo  = ark_mem->tcur;
  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;

  /* Evaluate g at initial t and check for zero values. */
  retval       = rootmem->gfun(rootmem->tlo, ark_mem->yn, rootmem->glo,
                               rootmem->root_data);
  rootmem->nge = 1;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (SUNRabs(rootmem->glo[i]) == ZERO)
    {
      zroot               = SUNTRUE;
      rootmem->gactive[i] = SUNFALSE;
    }
  }
  if (!zroot) { return (ARK_SUCCESS); }

  /* Some g_i is zero at t0; look at g at t0+(small increment). */
  hratio = SUNMAX(rootmem->ttol / SUNRabs(ark_mem->h), TENTH);
  smallh = hratio * ark_mem->h;
  tplus  = rootmem->tlo + smallh;
  N_VLinearSum(ONE, ark_mem->yn, smallh, ark_mem->fn, ark_mem->ycur);
  retval = rootmem->gfun(tplus, ark_mem->ycur, rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* We check now only the components of g which were exactly 0.0 at t0
   * to see if we can 'activate' them. */
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i] && SUNRabs(rootmem->ghi[i]) != ZERO)
    {
      rootmem->gactive[i] = SUNTRUE;
      rootmem->glo[i]     = rootmem->ghi[i];
    }
  }
  return (ARK_SUCCESS);
}